

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::anon_unknown_173::print_relationship
                   (string *__return_storage_ptr__,Relationship *rel,ListEditQual *qual,bool custom,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  string *psVar3;
  undefined7 in_register_00000009;
  uint32_t n;
  ListEditQual extraout_EDX;
  ListEditQual extraout_EDX_00;
  ListEditQual v;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  paVar1 = &local_1d8.field_2;
  v = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    v = extraout_EDX_00;
  }
  if (*qual != ResetToExplicit) {
    tinyusdz::to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*qual,v);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (rel->_varying_authored == true) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"varying ",8);
  }
  print_rel_only(&local_1d8,rel,(string *)CONCAT71(in_register_00000009,custom),(uint32_t)name);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar3 = (string *)std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string print_relationship(const Relationship &rel,
                               const ListEditQual &qual, const bool custom,
                               const std::string &name, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent);

  if (custom) {
    ss << "custom ";
  }

  // List editing
  if (qual != ListEditQual::ResetToExplicit) {
    ss << to_string(qual) << " ";
  }

  if (rel.is_varying_authored()) {
    ss << "varying ";
  }

  ss << print_rel_only(rel, name, indent);

  return ss.str();
}